

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

void __thiscall ON_Matrix::SetDiagonal(ON_Matrix *this,double *d)

{
  uint uVar1;
  double **ppdVar2;
  double ***pppdVar3;
  uint uVar4;
  ulong uVar5;
  
  Zero(this);
  if (d != (double *)0x0) {
    uVar1 = this->m_row_count;
    pppdVar3 = &this->m;
    if (uVar1 == (this->m_rowmem).m_count) {
      pppdVar3 = &(this->m_rowmem).m_a;
    }
    uVar4 = this->m_col_count;
    if ((int)uVar1 < this->m_col_count) {
      uVar4 = uVar1;
    }
    if (0 < (int)uVar4) {
      ppdVar2 = *pppdVar3;
      uVar5 = 0;
      do {
        ppdVar2[uVar5][uVar5] = d[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  return;
}

Assistant:

void ON_Matrix::SetDiagonal( const double* d )
{
  Zero();
  if (d) 
  {
    double** this_m = ThisM();
    const int n = MinCount();
    int i;
    for ( i = 0; i < n; i++ )
    {
      this_m[i][i] = *d++;
    }
  }
}